

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  SelectionVector *pSVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  idx_t local_68;
  long local_58;
  idx_t local_50;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        local_58 = 0;
      }
      else {
        psVar2 = result_sel->sel_vector;
        psVar3 = lsel->sel_vector;
        psVar4 = rsel->sel_vector;
        local_58 = 0;
        uVar13 = 0;
        do {
          uVar11 = uVar13;
          if (psVar2 != (sel_t *)0x0) {
            uVar11 = (ulong)psVar2[uVar13];
          }
          uVar7 = uVar13;
          if (psVar3 != (sel_t *)0x0) {
            uVar7 = (ulong)psVar3[uVar13];
          }
          uVar12 = uVar13;
          if (psVar4 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar4[uVar13];
          }
          iVar1 = ldata[uVar7].days;
          iVar14 = rdata[uVar12].days;
          lVar5 = ldata[uVar7].micros;
          lVar6 = rdata[uVar12].micros;
          if (((ldata[uVar7].months == rdata[uVar12].months) && (iVar1 == iVar14)) &&
             (iVar14 = iVar1, lVar5 == lVar6)) {
LAB_0147617c:
            false_sel->sel_vector[local_58] = (sel_t)uVar11;
            local_58 = local_58 + 1;
          }
          else {
            lVar10 = (long)iVar1 + lVar5 / 86400000000;
            lVar15 = (long)iVar14 + lVar6 / 86400000000;
            if ((((long)ldata[uVar7].months + lVar10 / 0x1e ==
                  (long)rdata[uVar12].months + lVar15 / 0x1e) && (lVar10 % 0x1e == lVar15 % 0x1e))
               && (lVar5 % 86400000000 == lVar6 % 86400000000)) goto LAB_0147617c;
          }
          uVar13 = uVar13 + 1;
        } while (count != uVar13);
      }
      return count - local_58;
    }
    if (count != 0) {
      psVar2 = result_sel->sel_vector;
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      local_68 = 0;
      uVar13 = 0;
      do {
        uVar11 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar13];
        }
        uVar7 = uVar13;
        if (psVar3 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar3[uVar13];
        }
        uVar12 = uVar13;
        if (psVar4 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar4[uVar13];
        }
        iVar1 = ldata[uVar7].days;
        iVar14 = rdata[uVar12].days;
        lVar5 = ldata[uVar7].micros;
        lVar6 = rdata[uVar12].micros;
        if (((ldata[uVar7].months != rdata[uVar12].months) || (iVar1 != iVar14)) ||
           (iVar14 = iVar1, lVar5 != lVar6)) {
          lVar10 = (long)iVar1 + lVar5 / 86400000000;
          lVar15 = (long)iVar14 + lVar6 / 86400000000;
          if ((((long)ldata[uVar7].months + lVar10 / 0x1e !=
                (long)rdata[uVar12].months + lVar15 / 0x1e) || (lVar10 % 0x1e != lVar15 % 0x1e)) ||
             (lVar5 % 86400000000 != lVar6 % 86400000000)) {
            true_sel->sel_vector[local_68] = (sel_t)uVar11;
            local_68 = local_68 + 1;
          }
        }
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
      return local_68;
    }
  }
  else if (count != 0) {
    psVar2 = result_sel->sel_vector;
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    local_68 = 0;
    local_50 = 0;
    uVar13 = 0;
    do {
      uVar11 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar2[uVar13];
      }
      uVar7 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar3[uVar13];
      }
      uVar12 = uVar13;
      if (psVar4 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar4[uVar13];
      }
      iVar1 = ldata[uVar7].days;
      iVar14 = rdata[uVar12].days;
      lVar5 = ldata[uVar7].micros;
      lVar6 = rdata[uVar12].micros;
      if (((ldata[uVar7].months == rdata[uVar12].months) && (iVar1 == iVar14)) &&
         (iVar14 = iVar1, lVar5 == lVar6)) {
LAB_01475e22:
        iVar8 = local_50;
        pSVar9 = false_sel;
        local_50 = local_50 + 1;
      }
      else {
        lVar10 = (long)iVar1 + lVar5 / 86400000000;
        lVar15 = (long)iVar14 + lVar6 / 86400000000;
        if ((((long)ldata[uVar7].months + lVar10 / 0x1e ==
              (long)rdata[uVar12].months + lVar15 / 0x1e) && (lVar10 % 0x1e == lVar15 % 0x1e)) &&
           (lVar5 % 86400000000 == lVar6 % 86400000000)) goto LAB_01475e22;
        iVar8 = local_68;
        pSVar9 = true_sel;
        local_68 = local_68 + 1;
      }
      pSVar9->sel_vector[iVar8] = (sel_t)uVar11;
      uVar13 = uVar13 + 1;
      if (count == uVar13) {
        return local_68;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}